

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O2

string * __thiscall
helics::inproc::InprocComms::getAddress_abi_cxx11_(string *__return_storage_ptr__,InprocComms *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_CommsInterface).localTargetAddress);
  return __return_storage_ptr__;
}

Assistant:

std::string InprocComms::getAddress() const
    {
        return localTargetAddress;
    }